

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiViewport *viewport;
  ImVec2 pos;
  ImRect *rect_rel;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff88;
  float fVar5;
  float fVar6;
  ImVec2 mx;
  ImVec2 local_28;
  ImVec2 local_20;
  ImRect *local_18;
  ImGuiContext *local_10;
  ImVec2 local_8;
  
  local_10 = GImGui;
  if ((((GImGui->NavDisableHighlight & 1U) == 0) && ((GImGui->NavDisableMouseHover & 1U) != 0)) &&
     (GImGui->NavWindow != (ImGuiWindow *)0x0)) {
    local_18 = GImGui->NavWindow->NavRectRel + GImGui->NavLayer;
    mx = (ImVec2)&GImGui->NavWindow->Pos;
    fVar5 = (local_18->Min).x;
    fVar6 = (GImGui->Style).FramePadding.x;
    fVar2 = ImRect::GetWidth(local_18);
    fVar3 = ImMin<float>(fVar6 * 4.0,fVar2);
    fVar3 = fVar5 + fVar3;
    fVar6 = (local_18->Max).y;
    fVar2 = (local_10->Style).FramePadding.y;
    fVar4 = ImRect::GetHeight(local_18);
    fVar4 = ImMin<float>(fVar2,fVar4);
    ImVec2::ImVec2(&local_28,fVar3,fVar6 - fVar4);
    local_20 = operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x144873);
    GetMainViewport();
    operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x14489d);
    ImClamp((ImVec2 *)CONCAT44(fVar3,fVar6),(ImVec2 *)CONCAT44(fVar2,fVar5),mx);
    local_8 = ImFloor(in_stack_ffffffffffffff88);
  }
  else {
    bVar1 = IsMousePosValid(&(GImGui->IO).MousePos);
    if (bVar1) {
      local_8 = (local_10->IO).MousePos;
    }
    else {
      local_8 = local_10->LastValidMousePos;
    }
  }
  return local_8;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.LastValidMousePos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = GetMainViewport();
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}